

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.hpp
# Opt level: O0

void remora::bindings::
     im2mat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::cpu_tag,remora::cpu_tag>>
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *images,matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
                        *output,size_t num_channels,size_t image_height,size_t image_width,
               size_t filter_height,size_t filter_width)

{
  matrix<double,_remora::row_major,_remora::cpu_tag> *pmVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pdVar4;
  long in_RCX;
  dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag> *in_RDX;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RSI;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  size_t c;
  size_t image_start;
  size_t col_start;
  size_t j1;
  size_t row_start;
  size_t j;
  size_t i1;
  size_t i;
  size_t im;
  size_t rows_per_image;
  value_type j_00;
  size_type i_00;
  dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag> *this;
  long local_68;
  long local_58;
  long local_50;
  long local_48;
  size_type local_40;
  
  local_40 = 0;
  while( true ) {
    i_00 = local_40;
    pmVar1 = matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
             ::operator()(in_RDI);
    sVar2 = matrix<double,_remora::row_major,_remora::cpu_tag>::size1(pmVar1);
    if (i_00 == sVar2) break;
    for (local_48 = 0; local_48 != (in_RCX - in_R9) + 1; local_48 = local_48 + 1) {
      for (local_50 = 0; local_50 != in_R9; local_50 = local_50 + 1) {
        for (local_58 = 0; local_58 != (in_R8 - in_stack_00000008) + 1; local_58 = local_58 + 1) {
          for (local_68 = 0; local_68 != in_stack_00000008; local_68 = local_68 + 1) {
            pmVar1 = (matrix<double,_remora::row_major,_remora::cpu_tag> *)
                     ((local_50 * in_stack_00000008 + local_68) * (long)in_RDX);
            sVar2 = ((local_48 + local_50) * in_R8 + local_58 + local_68) * (long)in_RDX;
            for (this = (dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
                         *)0x0; this != in_RDX;
                this = (dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
                        *)((long)&this->m_values + 1)) {
              matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
              ::operator()(in_RDI);
              pvVar3 = matrix<double,_remora::row_major,_remora::cpu_tag>::operator()
                                 (pmVar1,sVar2,(size_type)this);
              j_00 = *pvVar3;
              matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
              ::operator()(in_RSI);
              pdVar4 = dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
                       ::operator()(this,i_00,(size_type)j_00);
              *pdVar4 = j_00;
            }
          }
        }
      }
    }
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void im2mat(
	matrix_expression<E1, cpu_tag> const& images,
	matrix_expression<E2, cpu_tag>& output,
	std::size_t num_channels,
	std::size_t image_height,
	std::size_t image_width,
	std::size_t filter_height,
	std::size_t filter_width
){
	static_assert(std::is_same<typename E1::orientation, row_major>::value, "Column major not implemented");
	static_assert(std::is_same<typename E2::orientation, row_major>::value, "Column major not implemented");
	std::size_t rows_per_image = (image_height - filter_height +1) * (image_width - filter_width +1);
	//the order of loops is chosen such, that only very little changes of rows are performed
	for(std::size_t im = 0; im != images().size1(); ++im){
		for(std::size_t i = 0; i != image_height - filter_height +1; ++i){// iterate over row-positions in the image
			for(std::size_t i1 = 0; i1 != filter_height; ++i1){//iterate over the the rows of the current filter
				for(std::size_t j = 0; j != image_width - filter_width +1; ++j){//iterate over the column-position in the image
					std::size_t row_start = im * rows_per_image + i * (image_width - filter_width +1) + j;
					for(std::size_t j1 = 0; j1 != filter_width; ++j1){
						std::size_t col_start = (i1 * filter_width + j1) * num_channels;
						std::size_t image_start = ((i+i1) * image_width + j+j1) * num_channels;
						for(std::size_t c = 0; c != num_channels; ++c){//iterate over the channels
							output()(row_start, col_start + c) = images()(im,image_start + c);
						}
					}
				}
			}
		}
	}
}